

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

void __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::CopyingFileInputStream
          (CopyingFileInputStream *this,int file_descriptor)

{
  uint uVar1;
  
  (this->super_CopyingInputStream)._vptr_CopyingInputStream =
       (_func_int **)&PTR__CopyingFileInputStream_004dc1d0;
  this->file_ = file_descriptor;
  this->close_on_delete_ = false;
  this->is_closed_ = false;
  this->errno_ = 0;
  this->previous_seek_failed_ = false;
  uVar1 = fcntl(file_descriptor,3);
  fcntl(this->file_,4,(ulong)(uVar1 & 0xfffff7ff));
  return;
}

Assistant:

FileInputStream::CopyingFileInputStream::CopyingFileInputStream(
    int file_descriptor)
    : file_(file_descriptor),
      close_on_delete_(false),
      is_closed_(false),
      errno_(0),
      previous_seek_failed_(false) {
#ifndef _WIN32
  int flags = fcntl(file_, F_GETFL);
  flags &= ~O_NONBLOCK;
  fcntl(file_, F_SETFL, flags);
#endif
}